

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_gui.cpp
# Opt level: O1

bool I_SetCursor(FTexture *cursorpic)

{
  bool bVar1;
  FBitmap bmp;
  BYTE buffer [4096];
  undefined **local_1058;
  undefined1 *local_1050;
  undefined8 local_1048;
  undefined4 local_1040;
  char local_103c;
  undefined8 local_1038;
  undefined8 local_1030;
  undefined1 local_1028 [4104];
  
  SDL_ShowCursor(0);
  bVar1 = true;
  if ((cursorpic != (FTexture *)0x0) && (cursorpic->UseType != '\r')) {
    if ((cursorpic->Width < 0x21) && (cursorpic->Height < 0x21)) {
      SDL_LockSurface(0);
      memset(local_1028,0,0x1000);
      local_1058 = &PTR__FBitmap_0070dd30;
      local_1040 = 0x80;
      local_1048 = 0x2000000020;
      local_103c = '\0';
      local_1038 = 0;
      local_1030 = 0x2000000020;
      local_1050 = local_1028;
      (*cursorpic->_vptr_FTexture[4])(cursorpic,&local_1058,0,0,0,0);
      memcpy(_DAT_00000020,local_1050,0x1000);
      SDL_UnlockSurface(0);
      local_1058 = &PTR__FBitmap_0070dd30;
      if ((local_1050 != (undefined1 *)0x0) && (local_103c == '\x01')) {
        operator_delete__(local_1050);
      }
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool I_SetCursor(FTexture *cursorpic)
{
	SDL_ShowCursor(SDL_DISABLE);
	static SDL_Cursor *cursor;
	static SDL_Surface *cursorSurface;

	if (cursorpic != NULL && cursorpic->UseType != FTexture::TEX_Null)
	{
		// Must be no larger than 32x32.
		if (cursorpic->GetWidth() > 32 || cursorpic->GetHeight() > 32)
		{
			return false;
		}

		if (cursorSurface == NULL)
//			cursorSurface = SDL_CreateRGBSurface (0, 32, 32, 32, MAKEARGB(0,255,0,0), MAKEARGB(0,0,255,0), MAKEARGB(0,0,0,255), MAKEARGB(255,0,0,0));

		SDL_LockSurface(cursorSurface);
		BYTE buffer[32*32*4];
		memset(buffer, 0, 32*32*4);
		FBitmap bmp(buffer, 32*4, 32, 32);
		cursorpic->CopyTrueColorPixels(&bmp, 0, 0);
		memcpy(cursorSurface->pixels, bmp.GetPixels(), 32*32*4);
		SDL_UnlockSurface(cursorSurface);

//		if (cursor)
//			SDL_FreeCursor (cursor);
//		cursor = SDL_CreateColorCursor (cursorSurface, 0, 0);
//		SDL_SetCursor (cursor);
//		SDL_ShowCursor(SDL_ENABLE);
	}
	else
	{
		if (cursor)
		{
			SDL_SetCursor (NULL);
			SDL_FreeCursor (cursor);
			cursor = NULL;
		}
		if (cursorSurface != NULL)
		{
			SDL_FreeSurface(cursorSurface);
			cursorSurface = NULL;
		}
	}
	return true;
}